

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Auth.cpp
# Opt level: O0

Url * __thiscall Vault::Sys::Auth::getUrl(Url *__return_storage_ptr__,Auth *this,Path *path)

{
  long *plVar1;
  bool local_99;
  string local_98;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  allocator<char> local_41;
  string local_40 [32];
  Path *local_20;
  Path *path_local;
  Auth *this_local;
  
  plVar1 = *(long **)this;
  local_20 = path;
  path_local = (Path *)this;
  this_local = (Auth *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/v1/sys/auth",&local_41);
  local_99 = Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::empty(local_20);
  if (local_99) {
    Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Tiny(&local_78,local_20);
  }
  else {
    Vault::operator+(&local_98,"/",local_20);
    Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Tiny(&local_78,&local_98);
  }
  local_99 = !local_99;
  (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,local_40,&local_78);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_78);
  if (local_99) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Sys::Auth::getUrl(const Path &path) const {
  return client_.getUrl("/v1/sys/auth", path.empty() ? path : Path{"/" + path});
}